

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

SampledSpectrum pbrt::ClampZero(SampledSpectrum *s)

{
  float fVar1;
  float *pfVar2;
  Float *pFVar3;
  int i;
  SampledSpectrum ret;
  Float in_stack_ffffffffffffffdc;
  float fVar4;
  uint uVar5;
  array<float,_4> local_10;
  
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x67f6d3);
  for (uVar5 = 0; (int)uVar5 < 4; uVar5 = uVar5 + 1) {
    fVar4 = 0.0;
    in_stack_ffffffffffffffdc =
         SampledSpectrum::operator[]
                   ((SampledSpectrum *)((ulong)uVar5 << 0x20),(int)in_stack_ffffffffffffffdc);
    pfVar2 = std::max<float>((float *)&stack0xffffffffffffffe0,(float *)&stack0xffffffffffffffdc);
    fVar1 = *pfVar2;
    pFVar3 = SampledSpectrum::operator[]
                       ((SampledSpectrum *)CONCAT44(uVar5,fVar4),(int)in_stack_ffffffffffffffdc);
    *pFVar3 = fVar1;
  }
  return (array<float,_4>)(array<float,_4>)local_10.values;
}

Assistant:

PBRT_CPU_GPU
inline SampledSpectrum ClampZero(const SampledSpectrum &s) {
    SampledSpectrum ret;
    for (int i = 0; i < NSpectrumSamples; ++i)
        ret[i] = std::max<Float>(0, s[i]);
    DCHECK(!ret.HasNaNs());
    return ret;
}